

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

bool cfd::core::HDWallet::CheckValidMnemonic
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *mnemonic,string *language)

{
  bool bVar1;
  CfdException *this;
  undefined1 local_40 [32];
  
  bVar1 = CheckSupportedLanguages(language);
  if (bVar1) {
    bVar1 = WallyUtil::CheckValidMnemonic(mnemonic,language);
    return bVar1;
  }
  local_40._0_8_ = "cfdcore_hdwallet.cpp";
  local_40._8_4_ = 0x181;
  local_40._16_8_ = "CheckValidMnemonic";
  logger::log<std::__cxx11::string_const&>
            ((CfdSourceLocation *)local_40,kCfdLogLevelWarning,
             "Not support language passed. language=[{}]",language);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Not support language passed.","");
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool HDWallet::CheckValidMnemonic(
    const std::vector<std::string>& mnemonic, const std::string& language) {
  if (!CheckSupportedLanguages(language)) {
    warn(
        CFD_LOG_SOURCE, "Not support language passed. language=[{}]",
        language);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Not support language passed.");
  }

  return WallyUtil::CheckValidMnemonic(mnemonic, language);
}